

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureTestUtil.cpp
# Opt level: O3

void __thiscall
vkt::texture::util::TextureBinding::updateTextureData
          (TextureBinding *this,TestTextureSp *textureData,Type textureType)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  _func_int **pp_Var3;
  VkImage obj;
  Handle<(vk::HandleType)9> HVar4;
  DeviceInterface *pDVar5;
  VkDevice pVVar6;
  VkAllocationCallbacks *pVVar7;
  int iVar8;
  VkFormat value;
  uint uVar9;
  uint uVar10;
  VkResult VVar11;
  DeviceInterface *vk;
  VkDevice device;
  VkQueue pVVar12;
  SharedPtrStateBase *pSVar13;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  InstanceInterface *pIVar14;
  VkPhysicalDevice pVVar15;
  NotSupportedError *pNVar16;
  long *plVar17;
  long *plVar18;
  VkImageType VVar19;
  Handle<(vk::HandleType)9> HVar20;
  bool bVar21;
  deUint32 queueFamilyIndex;
  undefined1 local_118 [16];
  VkDevice local_108;
  VkAllocationCallbacks *pVStack_100;
  VkQueue local_f8;
  Allocator *local_f0;
  UVec3 textureDimension;
  Move<vk::Handle<(vk::HandleType)9>_> local_c8;
  VkImageFormatProperties imageFormatProperties;
  char *local_88;
  void *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  deUint32 local_48;
  deUint32 *local_40;
  VkImageLayout local_38;
  
  vk = Context::getDeviceInterface(this->m_context);
  device = Context::getDevice(this->m_context);
  pVVar12 = Context::getUniversalQueue(this->m_context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(this->m_context);
  local_f0 = Context::getDefaultAllocator(this->m_context);
  this->m_type = textureType;
  pSVar2 = (this->m_textureData).m_state;
  pSVar13 = textureData->m_state;
  if (pSVar2 != pSVar13) {
    if (pSVar2 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar2->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->m_textureData).m_ptr = (TestTexture *)0x0;
        (*((this->m_textureData).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->m_textureData).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar2 = (this->m_textureData).m_state;
        if (pSVar2 != (SharedPtrStateBase *)0x0) {
          (*pSVar2->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_textureData).m_state = (SharedPtrStateBase *)0x0;
      }
      pSVar13 = textureData->m_state;
    }
    (this->m_textureData).m_ptr = textureData->m_ptr;
    (this->m_textureData).m_state = pSVar13;
    if (pSVar13 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pSVar13->strongRefCount = pSVar13->strongRefCount + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->m_textureData).m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
    }
  }
  bVar21 = this->m_type == TYPE_CUBE_MAP;
  VVar19 = (textureType == TYPE_3D) + VK_IMAGE_TYPE_2D;
  local_f8 = pVVar12;
  iVar8 = (*textureData->m_ptr->_vptr_TestTexture[5])();
  pp_Var3 = textureData->m_ptr->_vptr_TestTexture;
  if ((char)iVar8 == '\0') {
    iVar8 = (*pp_Var3[0xe])();
    value = ::vk::mapTextureFormat((TextureFormat *)CONCAT44(extraout_var_00,iVar8));
  }
  else {
    iVar8 = (*pp_Var3[9])(textureData->m_ptr,0,0);
    value = ::vk::mapCompressedTextureFormat(*(CompressedTexFormat *)CONCAT44(extraout_var,iVar8));
  }
  (*textureData->m_ptr->_vptr_TestTexture[0xf])(&textureDimension);
  uVar9 = (*textureData->m_ptr->_vptr_TestTexture[2])();
  uVar10 = (*textureData->m_ptr->_vptr_TestTexture[4])();
  pIVar14 = Context::getInstanceInterface(this->m_context);
  pVVar15 = Context::getPhysicalDevice(this->m_context);
  VVar11 = (*pIVar14->_vptr_InstanceInterface[4])
                     (pIVar14,pVVar15,(ulong)value,(ulong)VVar19,0,6,(ulong)bVar21 << 4,
                      &imageFormatProperties);
  if (VVar11 == VK_ERROR_FORMAT_NOT_SUPPORTED) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_118._0_8_ = &local_108;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Format not supported: ","")
    ;
    ::vk::getFormatName(value);
    plVar17 = (long *)std::__cxx11::string::append(local_118);
    local_88 = (char *)*plVar17;
    plVar18 = plVar17 + 2;
    if ((long *)local_88 == plVar18) {
      local_78 = *plVar18;
      uStack_70 = plVar17[3];
      local_88 = (char *)&local_78;
    }
    else {
      local_78 = *plVar18;
    }
    local_80 = (void *)plVar17[1];
    *plVar17 = (long)plVar18;
    plVar17[1] = 0;
    *(undefined1 *)(plVar17 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,local_88,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x146);
    __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::checkResult(VVar11,"imageFormatQueryResult",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                    ,0x149);
  if (imageFormatProperties.maxArrayLayers < uVar10) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Maximum array layers number for this format is not enough for this test.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x14c);
  }
  else if (imageFormatProperties.maxMipLevels < uVar9) {
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Maximum mimap level number for this format is not enough for this test.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x14f);
  }
  else {
    if (((textureDimension.m_data[0] <= imageFormatProperties.maxExtent.width) &&
        (textureDimension.m_data[1] <= imageFormatProperties.maxExtent.height)) &&
       (textureDimension.m_data[2] <= imageFormatProperties.maxExtent.depth)) {
      local_88 = (char *)CONCAT44(local_88._4_4_,VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO);
      local_80 = (void *)0x0;
      local_78._0_4_ = (uint)bVar21 << 4;
      local_78._4_4_ = VVar19;
      uStack_70._4_4_ = textureDimension.m_data[0];
      uStack_70._0_4_ = value;
      local_68 = textureDimension.m_data[1];
      local_64 = textureDimension.m_data[2];
      local_58._0_4_ = VK_SAMPLE_COUNT_1_BIT;
      local_58._4_4_ = VK_IMAGE_TILING_OPTIMAL;
      uStack_50._0_4_ = 6;
      uStack_50._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
      local_48 = 1;
      local_40 = &queueFamilyIndex;
      local_38 = VK_IMAGE_LAYOUT_UNDEFINED;
      local_60 = uVar9;
      local_5c = uVar10;
      ::vk::createImage(&local_c8,vk,device,(VkImageCreateInfo *)&local_88,
                        (VkAllocationCallbacks *)0x0);
      pVVar7 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator;
      pVVar6 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
      pDVar5 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
      HVar20.m_internal =
           local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      local_108 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device;
      pVStack_100 = local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                    m_allocator;
      local_118._0_8_ =
           local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      local_118._8_8_ =
           local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface;
      local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
      local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
           (DeviceInterface *)0x0;
      local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device = (VkDevice)0x0
      ;
      local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
           (VkAllocationCallbacks *)0x0;
      obj.m_internal =
           (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
           m_internal;
      if (obj.m_internal == 0) {
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
             = pVVar6;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = pVVar7;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
        m_internal = HVar20.m_internal;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = pDVar5;
      }
      else {
        ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                  (&(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                    deleter,obj);
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device
             = local_108;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_allocator = pVStack_100;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
        m_internal = local_118._0_8_;
        (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
        m_deviceIface = (DeviceInterface *)local_118._8_8_;
        if (local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal != 0) {
          ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                    (&local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter,
                     (VkImage)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                              m_internal);
        }
      }
      ::vk::getImageMemoryRequirements
                ((VkMemoryRequirements *)local_118,vk,device,
                 (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                          m_data.object.m_internal);
      (*local_f0->_vptr_Allocator[3])(&local_c8,local_f0,(VkMemoryRequirements *)local_118,0);
      HVar4.m_internal =
           local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal;
      pVVar12 = local_f8;
      local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0;
      HVar20.m_internal =
           (deUint64)
           (this->m_textureImageMemory).
           super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
      if (HVar20.m_internal != HVar4.m_internal) {
        if ((Allocation *)HVar20.m_internal == (Allocation *)0x0) {
          (this->m_textureImageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)HVar4.m_internal;
          HVar20.m_internal = HVar4.m_internal;
        }
        else {
          (*((Allocation *)HVar20.m_internal)->_vptr_Allocation[1])();
          (this->m_textureImageMemory).
          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
               (Allocation *)HVar4.m_internal;
          HVar20.m_internal = HVar4.m_internal;
          if ((long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                      m_internal != (long *)0x0) {
            (**(code **)(*(long *)local_c8.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                                  object.m_internal + 8))();
            HVar20.m_internal =
                 (deUint64)
                 (this->m_textureImageMemory).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
          }
        }
      }
      VVar11 = (*vk->_vptr_DeviceInterface[0xd])
                         (vk,device,
                          (this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                          m_data.object.m_internal,
                          (((Allocation *)HVar20.m_internal)->m_memory).m_internal,
                          ((Allocation *)HVar20.m_internal)->m_offset);
      ::vk::checkResult(VVar11,
                        "vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset())"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
                        ,0x172);
      updateTextureViewMipLevels(this,0,uVar9 - 1);
      pipeline::uploadTestTexture
                (vk,device,pVVar12,queueFamilyIndex,local_f0,(this->m_textureData).m_ptr,
                 (VkImage)(this->m_textureImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.
                          m_data.object.m_internal);
      return;
    }
    pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar16,"Maximum image dimension for this format is not enough for this test.",
               (char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/texture/vktTextureTestUtil.cpp"
               ,0x155);
  }
  __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TextureBinding::updateTextureData (const TestTextureSp& textureData, const TextureBinding::Type textureType)
{
	const DeviceInterface&						vkd						= m_context.getDeviceInterface();
	const VkDevice								vkDevice				= m_context.getDevice();
	const VkQueue								queue					= m_context.getUniversalQueue();
	const deUint32								queueFamilyIndex		= m_context.getUniversalQueueFamilyIndex();
	Allocator&									allocator				= m_context.getDefaultAllocator();

	m_type			= textureType;
	m_textureData	= textureData;

	const bool									isCube					= m_type == TYPE_CUBE_MAP;
	const VkImageCreateFlags					imageCreateFlags		= isCube ? VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT : 0;
	const VkImageViewType						imageViewType			= textureTypeToImageViewType(textureType);
	const VkImageType							imageType				= imageViewTypeToImageType(imageViewType);
	const VkImageTiling							imageTiling				= VK_IMAGE_TILING_OPTIMAL;
	const VkImageUsageFlags						imageUsageFlags			= VK_IMAGE_USAGE_SAMPLED_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
	const VkFormat								format					= textureData->isCompressed() ? mapCompressedTextureFormat(textureData->getCompressedLevel(0, 0).getFormat()) : mapTextureFormat(textureData->getTextureFormat());
	const tcu::UVec3							textureDimension		= textureData->getTextureDimension();
	const deUint32								mipLevels				= textureData->getNumLevels();
	const deUint32								arraySize				= textureData->getArraySize();
	vk::VkImageFormatProperties					imageFormatProperties;
	const VkResult								imageFormatQueryResult	= m_context.getInstanceInterface().getPhysicalDeviceImageFormatProperties(m_context.getPhysicalDevice(), format, imageType, imageTiling, imageUsageFlags, imageCreateFlags, &imageFormatProperties);

	if (imageFormatQueryResult == VK_ERROR_FORMAT_NOT_SUPPORTED)
	{
		TCU_THROW(NotSupportedError, (std::string("Format not supported: ") + vk::getFormatName(format)).c_str());
	}
	else
		VK_CHECK(imageFormatQueryResult);

	if (imageFormatProperties.maxArrayLayers < arraySize)
		TCU_THROW(NotSupportedError, ("Maximum array layers number for this format is not enough for this test."));

	if (imageFormatProperties.maxMipLevels < mipLevels)
		TCU_THROW(NotSupportedError, ("Maximum mimap level number for this format is not enough for this test."));

	if (imageFormatProperties.maxExtent.width < textureDimension.x() ||
		imageFormatProperties.maxExtent.height < textureDimension.y() ||
		imageFormatProperties.maxExtent.depth < textureDimension.z())
	{
		TCU_THROW(NotSupportedError, ("Maximum image dimension for this format is not enough for this test."));
	}

	// Create image
	const VkImageCreateInfo						imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,							// VkStructureType			sType;
		DE_NULL,														// const void*				pNext;
		imageCreateFlags,												// VkImageCreateFlags		flags;
		imageType,														// VkImageType				imageType;
		format,															// VkFormat					format;
		{																// VkExtent3D				extent;
			(deUint32)textureDimension.x(),
			(deUint32)textureDimension.y(),
			(deUint32)textureDimension.z()
		},
		mipLevels,														// deUint32					mipLevels;
		arraySize,														// deUint32					arrayLayers;
		VK_SAMPLE_COUNT_1_BIT,											// VkSampleCountFlagBits	samples;
		imageTiling,													// VkImageTiling			tiling;
		imageUsageFlags,												// VkImageUsageFlags		usage;
		VK_SHARING_MODE_EXCLUSIVE,										// VkSharingMode			sharingMode;
		1u,																// deUint32					queueFamilyIndexCount;
		&queueFamilyIndex,												// const deUint32*			pQueueFamilyIndices;
		VK_IMAGE_LAYOUT_UNDEFINED										// VkImageLayout			initialLayout;
	};

	m_textureImage			= createImage(vkd, vkDevice, &imageParams);
	m_textureImageMemory	= allocator.allocate(getImageMemoryRequirements(vkd, vkDevice, *m_textureImage), MemoryRequirement::Any);
	VK_CHECK(vkd.bindImageMemory(vkDevice, *m_textureImage, m_textureImageMemory->getMemory(), m_textureImageMemory->getOffset()));

	updateTextureViewMipLevels(0, mipLevels - 1);

	pipeline::uploadTestTexture(vkd, vkDevice, queue, queueFamilyIndex, allocator, *m_textureData, *m_textureImage);
}